

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O2

void MultRow_SSE2(uint8_t *ptr,uint8_t *alpha,int width,int inverse)

{
  ulong uVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  unkuint9 Var26;
  undefined1 auVar27 [11];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [16];
  ulong uVar36;
  int width_00;
  undefined1 auVar37 [16];
  
  auVar35 = _DAT_001a8610;
  uVar36 = 0;
  if (inverse == 0) {
    uVar36 = 0;
    while ((long)(uVar36 + 8) <= (long)width) {
      uVar1 = *(ulong *)(ptr + uVar36);
      uVar2 = *(ulong *)(alpha + uVar36);
      auVar11._8_6_ = 0;
      auVar11._0_8_ = uVar1;
      auVar11[0xe] = (char)(uVar1 >> 0x38);
      auVar13._8_4_ = 0;
      auVar13._0_8_ = uVar1;
      auVar13[0xc] = (char)(uVar1 >> 0x30);
      auVar13._13_2_ = auVar11._13_2_;
      auVar15._8_4_ = 0;
      auVar15._0_8_ = uVar1;
      auVar15._12_3_ = auVar13._12_3_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar1;
      auVar17[10] = (char)(uVar1 >> 0x28);
      auVar17._11_4_ = auVar15._11_4_;
      auVar19._8_2_ = 0;
      auVar19._0_8_ = uVar1;
      auVar19._10_5_ = auVar17._10_5_;
      auVar21[8] = (char)(uVar1 >> 0x20);
      auVar21._0_8_ = uVar1;
      auVar21._9_6_ = auVar19._9_6_;
      auVar25._7_8_ = 0;
      auVar25._0_7_ = auVar21._8_7_;
      Var26 = CONCAT81(SUB158(auVar25 << 0x40,7),(char)(uVar1 >> 0x18));
      auVar31._9_6_ = 0;
      auVar31._0_9_ = Var26;
      auVar27._1_10_ = SUB1510(auVar31 << 0x30,5);
      auVar27[0] = (char)(uVar1 >> 0x10);
      auVar32._11_4_ = 0;
      auVar32._0_11_ = auVar27;
      auVar23[2] = (char)(uVar1 >> 8);
      auVar23._0_2_ = (ushort)uVar1;
      auVar23._3_12_ = SUB1512(auVar32 << 0x20,3);
      auVar12._8_6_ = 0;
      auVar12._0_8_ = uVar2;
      auVar12[0xe] = (char)(uVar2 >> 0x38);
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar2;
      auVar14[0xc] = (char)(uVar2 >> 0x30);
      auVar14._13_2_ = auVar12._13_2_;
      auVar16._8_4_ = 0;
      auVar16._0_8_ = uVar2;
      auVar16._12_3_ = auVar14._12_3_;
      auVar18._8_2_ = 0;
      auVar18._0_8_ = uVar2;
      auVar18[10] = (char)(uVar2 >> 0x28);
      auVar18._11_4_ = auVar16._11_4_;
      auVar20._8_2_ = 0;
      auVar20._0_8_ = uVar2;
      auVar20._10_5_ = auVar18._10_5_;
      auVar22[8] = (char)(uVar2 >> 0x20);
      auVar22._0_8_ = uVar2;
      auVar22._9_6_ = auVar20._9_6_;
      auVar28._7_8_ = 0;
      auVar28._0_7_ = auVar22._8_7_;
      Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar33._9_6_ = 0;
      auVar33._0_9_ = Var29;
      auVar30._1_10_ = SUB1510(auVar33 << 0x30,5);
      auVar30[0] = (char)(uVar2 >> 0x10);
      auVar34._11_4_ = 0;
      auVar34._0_11_ = auVar30;
      auVar24[2] = (char)(uVar2 >> 8);
      auVar24._0_2_ = (ushort)uVar2;
      auVar24._3_12_ = SUB1512(auVar34 << 0x20,3);
      auVar37._0_2_ = ((ushort)uVar2 & 0xff) * ((ushort)uVar1 & 0xff) + 0x80;
      auVar37._2_2_ = auVar24._2_2_ * auVar23._2_2_ + 0x80;
      auVar37._4_2_ = auVar30._0_2_ * auVar27._0_2_ + 0x80;
      auVar37._6_2_ = (short)Var29 * (short)Var26 + 0x80;
      auVar37._8_2_ = auVar22._8_2_ * auVar21._8_2_ + 0x80;
      auVar37._10_2_ = auVar18._10_2_ * auVar17._10_2_ + 0x80;
      auVar37._12_2_ = auVar14._12_2_ * auVar13._12_2_ + 0x80;
      auVar37._14_2_ = (auVar12._13_2_ >> 8) * (auVar11._13_2_ >> 8) + 0x80;
      auVar37 = pmulhuw(auVar37,auVar35);
      sVar3 = auVar37._0_2_;
      sVar4 = auVar37._2_2_;
      sVar5 = auVar37._4_2_;
      sVar6 = auVar37._6_2_;
      sVar7 = auVar37._8_2_;
      sVar8 = auVar37._10_2_;
      sVar9 = auVar37._12_2_;
      sVar10 = auVar37._14_2_;
      *(ulong *)(ptr + uVar36) =
           CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar37[0xe] - (0xff < sVar10),
                    CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar37[0xc] - (0xff < sVar9),
                             CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar37[10] - (0xff < sVar8),
                                      CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar37[8] -
                                               (0xff < sVar7),
                                               CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar37[6] -
                                                        (0xff < sVar6),
                                                        CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                                 auVar37[4] - (0xff < sVar5),
                                                                 CONCAT11((0 < sVar4) *
                                                                          (sVar4 < 0x100) *
                                                                          auVar37[2] -
                                                                          (0xff < sVar4),
                                                                          (0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar37[0] -
                                                                          (0xff < sVar3))))))));
      uVar36 = uVar36 + 8;
    }
  }
  width_00 = width - (int)uVar36;
  if (width_00 != 0 && (int)uVar36 <= width) {
    WebPMultRow_C(ptr + (uVar36 & 0xffffffff),alpha + (uVar36 & 0xffffffff),width_00,inverse);
    return;
  }
  return;
}

Assistant:

static void MultRow_SSE2(uint8_t* WEBP_RESTRICT const ptr,
                         const uint8_t* WEBP_RESTRICT const alpha,
                         int width, int inverse) {
  int x = 0;
  if (!inverse) {
    const __m128i zero = _mm_setzero_si128();
    const __m128i k128 = _mm_set1_epi16(128);
    const __m128i kMult = _mm_set1_epi16(0x0101);
    for (x = 0; x + 8 <= width; x += 8) {
      const __m128i v0 = _mm_loadl_epi64((__m128i*)&ptr[x]);
      const __m128i a0 = _mm_loadl_epi64((const __m128i*)&alpha[x]);
      const __m128i v1 = _mm_unpacklo_epi8(v0, zero);
      const __m128i a1 = _mm_unpacklo_epi8(a0, zero);
      const __m128i v2 = _mm_mullo_epi16(v1, a1);
      const __m128i v3 = _mm_add_epi16(v2, k128);
      const __m128i v4 = _mm_mulhi_epu16(v3, kMult);
      const __m128i v5 = _mm_packus_epi16(v4, zero);
      _mm_storel_epi64((__m128i*)&ptr[x], v5);
    }
  }
  width -= x;
  if (width > 0) WebPMultRow_C(ptr + x, alpha + x, width, inverse);
}